

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_bitcode_parser.cpp
# Opt level: O3

bool __thiscall dxil_spv::LLVMBCParser::parse(LLVMBCParser *this,void *data,size_t size)

{
  Module *pMVar1;
  
  pMVar1 = LLVMBC::parseIR(&((this->impl)._M_t.
                             super___uniq_ptr_impl<dxil_spv::LLVMBCParser::Impl,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_dxil_spv::LLVMBCParser::Impl_*,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
                             .super__Head_base<0UL,_dxil_spv::LLVMBCParser::Impl_*,_false>.
                            _M_head_impl)->context,data,size);
  ((this->impl)._M_t.
   super___uniq_ptr_impl<dxil_spv::LLVMBCParser::Impl,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
   ._M_t.
   super__Tuple_impl<0UL,_dxil_spv::LLVMBCParser::Impl_*,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
   .super__Head_base<0UL,_dxil_spv::LLVMBCParser::Impl_*,_false>._M_head_impl)->module = pMVar1;
  return ((this->impl)._M_t.
          super___uniq_ptr_impl<dxil_spv::LLVMBCParser::Impl,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_dxil_spv::LLVMBCParser::Impl_*,_std::default_delete<dxil_spv::LLVMBCParser::Impl>_>
          .super__Head_base<0UL,_dxil_spv::LLVMBCParser::Impl_*,_false>._M_head_impl)->module !=
         (Module *)0x0;
}

Assistant:

bool LLVMBCParser::parse(const void *data, size_t size)
{
#ifdef HAVE_LLVMBC
	impl->module = llvm::parseIR(impl->context, data, size);
	if (!impl->module)
		return false;
#else
	auto memory = llvm::WritableMemoryBuffer::getNewUninitMemBuffer(size);
	memcpy(memory->getBufferStart(), data, size);

	llvm::SMDiagnostic error;
	impl->module = llvm::parseIR(*memory, error, impl->context);
	if (!impl->module)
	{
		error.print("DXIL", llvm::errs());
		return false;
	}
#endif

	return true;
}